

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.h
# Opt level: O2

void __thiscall
slang::ast::EventListControl::visitExprs<slang::ast::builtins::SequenceMethodExprVisitor&>
          (EventListControl *this,SequenceMethodExprVisitor *visitor)

{
  pointer ppTVar1;
  size_type sVar2;
  long lVar3;
  
  ppTVar1 = (this->events).data_;
  sVar2 = (this->events).size_;
  for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    TimingControl::visit<slang::ast::builtins::SequenceMethodExprVisitor>
              (*(TimingControl **)((long)ppTVar1 + lVar3),visitor);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto ev : events)
            ev->visit(visitor);
    }